

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void crnlib::vector<crnlib::find_files::file_desc>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  file_desc *local_38;
  file_desc *pDst;
  file_desc *pSrc_end;
  file_desc *pSrc;
  uint num_local;
  void *pSrc_void_local;
  void *pDst_void_local;
  
  local_38 = (file_desc *)pDst_void;
  for (pSrc_end = (file_desc *)pSrc_void;
      pSrc_end != (file_desc *)((long)pSrc_void + (ulong)num * 0x48); pSrc_end = pSrc_end + 1) {
    find_files::file_desc::file_desc(local_38,pSrc_end);
    find_files::file_desc::~file_desc(pSrc_end);
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }